

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_> *
__thiscall
__cxxabiv1::(anonymous_namespace)::
base_name<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
          (basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          *s)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  size_type __size;
  long lVar9;
  bool bVar10;
  
  uVar1 = *(ulong *)(this + 8);
  if (uVar1 == 0) {
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::basic_string(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                    *)this);
  }
  else {
    sVar6 = 0xb;
    if (uVar1 < 0xb) {
      sVar6 = uVar1;
    }
    iVar3 = bcmp(*(void **)this,"std::string",sVar6);
    if ((uVar1 == 0xb) && (iVar3 == 0)) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::_M_replace((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                    *)this,0,0xb,
                   "std::basic_string<char, std::char_traits<char>, std::allocator<char> >",0x46);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "basic_string";
      pcVar5 = "";
    }
    else {
      sVar6 = 0xc;
      if (uVar1 < 0xc) {
        sVar6 = uVar1;
      }
      iVar3 = bcmp(*(void **)this,"std::istream",sVar6);
      if ((uVar1 == 0xc) && (iVar3 == 0)) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
        ::_M_replace((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                      *)this,0,0xc,"std::basic_istream<char, std::char_traits<char> >",0x31);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "basic_istream";
        pcVar5 = "";
      }
      else {
        sVar6 = 0xc;
        if (uVar1 < 0xc) {
          sVar6 = uVar1;
        }
        iVar3 = bcmp(*(void **)this,"std::ostream",sVar6);
        if ((uVar1 == 0xc) && (iVar3 == 0)) {
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          ::_M_replace((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                        *)this,0,0xc,"std::basic_ostream<char, std::char_traits<char> >",0x31);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar8 = "basic_ostream";
          pcVar5 = "";
        }
        else {
          sVar6 = 0xd;
          if (uVar1 < 0xd) {
            sVar6 = uVar1;
          }
          iVar3 = bcmp(*(void **)this,"std::iostream",sVar6);
          if ((uVar1 == 0xd) && (iVar3 == 0)) {
            std::__cxx11::
            basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
            ::_M_replace((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                          *)this,0,0xd,"std::basic_iostream<char, std::char_traits<char> >",0x32);
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar8 = "basic_iostream";
            pcVar5 = "";
          }
          else {
            pcVar2 = *(char **)this;
            pcVar7 = pcVar2 + uVar1;
            pcVar5 = pcVar7;
            if (pcVar2[uVar1 - 1] == '>') {
              bVar10 = pcVar7 + -1 == pcVar2;
              pcVar5 = pcVar7 + -1;
              if (!bVar10) {
                pcVar7 = pcVar2 + (uVar1 - 2);
                lVar9 = uVar1 - 1;
                iVar3 = 1;
                do {
                  if (*pcVar7 == '>') {
                    iVar3 = iVar3 + 1;
                  }
                  else if ((*pcVar7 == '<') && (iVar3 = iVar3 + -1, iVar3 == 0)) goto LAB_001ad891;
                  pcVar7 = pcVar7 + -1;
                  lVar9 = lVar9 + -1;
                  bVar10 = lVar9 == 0;
                  pcVar5 = pcVar2;
                } while (!bVar10);
              }
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              __return_storage_ptr__->_M_string_length = 0;
              (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
              pcVar7 = pcVar5;
LAB_001ad891:
              pcVar5 = pcVar7;
              if (bVar10) {
                return __return_storage_ptr__;
              }
            }
            do {
              pcVar4 = pcVar7 + -1;
              pcVar8 = pcVar2;
              if (pcVar4 == pcVar2) break;
              pcVar8 = pcVar7;
              pcVar7 = pcVar4;
            } while (*pcVar4 != ':');
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          }
        }
      }
    }
    std::__cxx11::
    basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
    ::_M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                *)__return_storage_ptr__,pcVar8,pcVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

String
base_name(String& s)
{
    if (s.empty())
        return s;
    if (s == "std::string")
    {
        s = "std::basic_string<char, std::char_traits<char>, std::allocator<char> >";
        return "basic_string";
    }
    if (s == "std::istream")
    {
        s = "std::basic_istream<char, std::char_traits<char> >";
        return "basic_istream";
    }
    if (s == "std::ostream")
    {
        s = "std::basic_ostream<char, std::char_traits<char> >";
        return "basic_ostream";
    }
    if (s == "std::iostream")
    {
        s = "std::basic_iostream<char, std::char_traits<char> >";
        return "basic_iostream";
    }
    const char* const pf = s.data();
    const char* pe = pf + s.size();
    if (pe[-1] == '>')
    {
        unsigned c = 1;
        while (true)
        {
            if (--pe == pf)
                return String();
            if (pe[-1] == '<')
            {
                if (--c == 0)
                {
                    --pe;
                    break;
                }
            }
            else if (pe[-1] == '>')
                ++c;
        }
    }
    const char* p0 = pe - 1;
    for (; p0 != pf; --p0)
    {
        if (*p0 == ':')
        {
            ++p0;
            break;
        }
    }
    return String(p0, pe);
}